

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

PolymorphicInlineCache * __thiscall
Js::FunctionBody::CreateNewPolymorphicInlineCache
          (FunctionBody *this,uint index,PropertyId propertyId,InlineCache *inlineCache)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  PolymorphicInlineCache *pPVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  ulong uVar7;
  
  pPVar4 = GetPolymorphicInlineCache(this,index);
  if (pPVar4 != (PolymorphicInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1907,"(GetPolymorphicInlineCache(index) == nullptr)",
                                "GetPolymorphicInlineCache(index) == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar3 = GetRootObjectLoadInlineCacheStart(this);
  if ((index < uVar3) &&
     (bVar2 = Phases::IsEnabled((Phases *)&DAT_01441eb0,PolymorphicInlineCachePhase), !bVar2)) {
    pPVar4 = CreatePolymorphicInlineCache(this,index,4);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,PolymorphicInlineCachePhase);
    if ((bVar2) && (DAT_0145948a == '\x01')) {
      DumpFullFunctionName(this);
      Output::Print(L": New PIC, index = %d, size = %d\n",(ulong)index,4);
    }
    pTVar6 = InlineCache::GetType(inlineCache);
    uVar7 = (ulong)pPVar4->size + 0xffffffff & (ulong)pTVar6 >> 6;
    InlineCache::CopyTo(inlineCache,propertyId,
                        (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext,
                        pPVar4->inlineCaches + (uVar7 & 0xffffffff));
    PolymorphicInlineCache::UpdateInlineCachesFillInfo(pPVar4,(uint)uVar7,true);
    return pPVar4;
  }
  return (PolymorphicInlineCache *)0x0;
}

Assistant:

PolymorphicInlineCache * FunctionBody::CreateNewPolymorphicInlineCache(uint index, PropertyId propertyId, InlineCache * inlineCache)
    {
        Assert(GetPolymorphicInlineCache(index) == nullptr);
        // Only create polymorphic inline caches for non-root inline cache indexes
        if (index < GetRootObjectLoadInlineCacheStart()
#if DBG
            && !PHASE_OFF1(Js::PolymorphicInlineCachePhase)
#endif
            )
        {
            PolymorphicInlineCache * polymorphicInlineCache = CreatePolymorphicInlineCache(index, MinPolymorphicInlineCacheSize);
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (PHASE_VERBOSE_TRACE1(Js::PolymorphicInlineCachePhase))
            {
                this->DumpFullFunctionName();
                Output::Print(_u(": New PIC, index = %d, size = %d\n"), index, MinPolymorphicInlineCacheSize);
            }

#endif
#if PHASE_PRINT_INTRUSIVE_TESTTRACE1
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
            PHASE_PRINT_INTRUSIVE_TESTTRACE1(
                Js::PolymorphicInlineCachePhase,
                _u("TestTrace PIC:  New, Function %s (%s), 0x%x, index = %d, size = %d\n"), this->GetDisplayName(), this->GetDebugNumberSet(debugStringBuffer), polymorphicInlineCache, index, MinPolymorphicInlineCacheSize);

            uint indexInPolymorphicCache = polymorphicInlineCache->GetInlineCacheIndexForType(inlineCache->GetType());
            inlineCache->CopyTo(propertyId, m_scriptContext, &(polymorphicInlineCache->GetInlineCaches()[indexInPolymorphicCache]));
            polymorphicInlineCache->UpdateInlineCachesFillInfo(indexInPolymorphicCache, true /*set*/);

            return polymorphicInlineCache;
        }
        return nullptr;
    }